

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

thousands_sep_result<wchar_t> * fmt::v11::detail::thousands_sep_impl<wchar_t>(locale_ref loc)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  wchar_t wVar3;
  numpunct *pnVar4;
  thousands_sep_result<wchar_t> *in_RDI;
  string grouping;
  _Alloc_hider local_40;
  size_type local_38;
  char local_30;
  undefined7 uStack_2f;
  undefined8 uStack_28;
  
  locale_ref::get<std::locale>((locale_ref *)&local_40);
  pnVar4 = std::use_facet<std::__cxx11::numpunct<wchar_t>>((locale *)&local_40);
  std::locale::~locale((locale *)&local_40);
  (**(code **)(*(long *)pnVar4 + 0x20))(&local_40,pnVar4);
  if (local_38 == 0) {
    wVar3 = L'\0';
  }
  else {
    wVar3 = (**(code **)(*(long *)pnVar4 + 0x18))(pnVar4);
  }
  sVar2 = local_38;
  paVar1 = &(in_RDI->grouping).field_2;
  (in_RDI->grouping)._M_dataplus._M_p = (pointer)paVar1;
  if (local_40._M_p == &local_30) {
    paVar1->_M_allocated_capacity = CONCAT71(uStack_2f,local_30);
    *(undefined8 *)((long)&(in_RDI->grouping).field_2 + 8) = uStack_28;
  }
  else {
    (in_RDI->grouping)._M_dataplus._M_p = local_40._M_p;
    (in_RDI->grouping).field_2._M_allocated_capacity = CONCAT71(uStack_2f,local_30);
  }
  local_38 = 0;
  (in_RDI->grouping)._M_string_length = sVar2;
  local_30 = '\0';
  in_RDI->thousands_sep = wVar3;
  local_40._M_p = &local_30;
  std::__cxx11::string::~string((string *)&local_40);
  return in_RDI;
}

Assistant:

FMT_FUNC auto thousands_sep_impl(locale_ref loc) -> thousands_sep_result<Char> {
  auto&& facet = use_facet<numpunct<Char>>(loc.get<locale>());
  auto grouping = facet.grouping();
  auto thousands_sep = grouping.empty() ? Char() : facet.thousands_sep();
  return {std::move(grouping), thousands_sep};
}